

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O3

void long_help(void)

{
  char cVar1;
  int iVar2;
  char *__s1;
  char *pcVar3;
  
  __s1 = lafe_getprogname();
  fflush(_stderr);
  iVar2 = strcmp(__s1,"bsdcpio");
  pcVar3 = "(bsdcpio)";
  if (iVar2 == 0) {
    pcVar3 = "";
  }
  printf("%s%s: manipulate archive files\n",__s1,pcVar3);
  pcVar3 = 
  "First option must be a mode specifier:\n  -i Input  -o Output  -p Pass\nCommon Options:\n  -v Verbose filenames     -V  one dot per file\nCreate: %p -o [options]  < [list of files] > [archive]\n  -J,-y,-z,--lzma  Compress archive with xz/bzip2/gzip/lzma\n  --format {pwb|bin|odc|newc|ustar}  Select archive format\nList: %p -it < [archive]\nExtract: %p -i [options] < [archive]\n"
  ;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '%') {
      if (pcVar3[1] != 'p') {
        iVar2 = 0x25;
        goto LAB_0010a4dd;
      }
      pcVar3 = pcVar3 + 1;
      fputs(__s1,_stdout);
    }
    else {
      if (cVar1 == '\0') {
        version();
      }
      iVar2 = (int)cVar1;
LAB_0010a4dd:
      putchar(iVar2);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

static void
long_help(void)
{
	const char	*prog;
	const char	*p;

	prog = lafe_getprogname();

	fflush(stderr);

	p = (strcmp(prog,"bsdcpio") != 0) ? "(bsdcpio)" : "";
	printf("%s%s: manipulate archive files\n", prog, p);

	for (p = long_help_msg; *p != '\0'; p++) {
		if (*p == '%') {
			if (p[1] == 'p') {
				fputs(prog, stdout);
				p++;
			} else
				putchar('%');
		} else
			putchar(*p);
	}
	version();
}